

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

thread_ret_t ggml_graph_compute_thread(void *data)

{
  int *piVar1;
  int iVar2;
  long in_RDI;
  int n_threads;
  ggml_compute_state *state;
  undefined1 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffd9;
  byte in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  int iVar3;
  
  iVar3 = *(int *)(*(long *)(in_RDI + 0x30) + 4);
  while( true ) {
    LOCK();
    piVar1 = (int *)(*(long *)(in_RDI + 0x30) + 8);
    iVar2 = *piVar1;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (iVar2 == iVar3 + -1) {
      in_stack_ffffffffffffffdb = 0;
      LOCK();
      *(undefined1 *)(*(long *)(in_RDI + 0x30) + 0xc) = 0;
      UNLOCK();
    }
    else {
      while (in_stack_ffffffffffffffda = *(byte *)(*(long *)(in_RDI + 0x30) + 0xc),
            (in_stack_ffffffffffffffda & 1) != 0) {
        in_stack_ffffffffffffffd9 = *(byte *)(*(long *)(in_RDI + 0x30) + 0xd);
        if ((in_stack_ffffffffffffffd9 & 1) != 0) {
          return (thread_ret_t)0x0;
        }
      }
    }
    LOCK();
    piVar1 = (int *)(*(long *)(in_RDI + 0x30) + 8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    while (((*(byte *)(*(long *)(in_RDI + 0x30) + 0xc) ^ 0xff) & 1) != 0) {
      if ((*(byte *)(*(long *)(in_RDI + 0x30) + 0xd) & 1) != 0) {
        return (thread_ret_t)0x0;
      }
    }
    if (((*(byte *)(*(long *)(in_RDI + 0x30) + 0xd) & 1) != 0) || (*(long *)(in_RDI + 0x28) == 0))
    break;
    if (*(int *)(in_RDI + 0xc) < *(int *)(in_RDI + 0x10)) {
      ggml_compute_forward
                ((ggml_compute_params *)CONCAT44(iVar3,1),
                 (ggml_tensor *)
                 CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffdb,
                                         CONCAT12(in_stack_ffffffffffffffda,
                                                  CONCAT11(in_stack_ffffffffffffffd9,
                                                           in_stack_ffffffffffffffd8)))));
    }
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  return (thread_ret_t)0x0;
}

Assistant:

static thread_ret_t ggml_graph_compute_thread(void * data) {
    struct ggml_compute_state * state = (struct ggml_compute_state *) data;

    const int n_threads = state->shared->n_threads;

    while (true) {
        if (atomic_fetch_add(&state->shared->n_ready, 1) == n_threads - 1) {
            atomic_store(&state->shared->has_work, false);
        } else {
            while (atomic_load(&state->shared->has_work)) {
                if (atomic_load(&state->shared->stop)) {
                    return 0;
                }
                ggml_lock_lock  (&state->shared->spin);
                ggml_lock_unlock(&state->shared->spin);
            }
        }

        atomic_fetch_sub(&state->shared->n_ready, 1);

        // wait for work
        while (!atomic_load(&state->shared->has_work)) {
            if (atomic_load(&state->shared->stop)) {
                return 0;
            }
            ggml_lock_lock  (&state->shared->spin);
            ggml_lock_unlock(&state->shared->spin);
        }

        // check if we should stop
        if (atomic_load(&state->shared->stop)) {
            break;
        }

        if (state->node) {
            if (state->params.ith < state->params.nth) {
                ggml_compute_forward(&state->params, state->node);
            }

            state->node = NULL;
        } else {
            break;
        }
    }

    return 0;
}